

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O1

bool __thiscall
cmsys::SystemInformationImplementation::RetreiveInformationFromCpuInfoFile
          (SystemInformationImplementation *this)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  double dVar4;
  _Alloc_hider _Var5;
  SystemInformationImplementation *pSVar6;
  int iVar7;
  int iVar8;
  FILE *__stream;
  long lVar9;
  ulonglong uVar10;
  long *plVar11;
  long *plVar12;
  char cVar13;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  float fVar17;
  string cpuflags;
  string buffer;
  vector<const_char_*,_std::allocator<const_char_*>_> cachename;
  string cpurev;
  string familyStr;
  string CPUSpeed;
  string Cores;
  string idc;
  set<int,_std::less<int>,_std::allocator<int>_> PhysicalIDs;
  string local_388;
  undefined1 *local_368;
  long local_360;
  undefined1 local_358;
  undefined7 uStack_357;
  char **local_348;
  iterator iStack_340;
  char **local_338;
  string local_330;
  SystemInformationImplementation *local_310;
  string local_308;
  string local_2e8;
  string local_2c8;
  long *local_2a8;
  long local_2a0;
  long local_298;
  long lStack_290;
  FILE *local_288;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  this->NumberOfLogicalCPU = 0;
  this->NumberOfPhysicalCPU = 0;
  local_368 = &local_358;
  local_360 = 0;
  local_358 = 0;
  __stream = fopen64("/proc/cpuinfo","r");
  if (__stream == (FILE *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Problem opening /proc/cpuinfo",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
    goto LAB_004903c9;
  }
  iVar7 = feof(__stream);
  cVar13 = -2;
  if (iVar7 == 0) {
    do {
      fgetc(__stream);
      std::__cxx11::string::push_back((char)&local_368);
      iVar7 = feof(__stream);
      cVar13 = cVar13 + '\x01';
    } while (iVar7 == 0);
  }
  fclose(__stream);
  std::__cxx11::string::resize((ulong)&local_368,cVar13);
  lVar9 = std::__cxx11::string::find((char *)&local_368,0x593d27,0);
  if (lVar9 != -1) {
    do {
      this->NumberOfLogicalCPU = this->NumberOfLogicalCPU + 1;
      lVar9 = std::__cxx11::string::find((char *)&local_368,0x593d27,lVar9 + 1);
    } while (lVar9 != -1);
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c0,local_368,local_368 + local_360);
  ExtractValueFromCpuInfoFile(&local_a0,this,&local_c0,"physical id",0);
  local_288 = __stream;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  local_310 = this;
  if (this->CurrentPositionInFile != 0xffffffffffffffff) {
    do {
      local_2e8._M_dataplus._M_p._0_4_ = atoi(local_a0._M_dataplus._M_p);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_60,(int *)&local_2e8);
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_e0,local_368,local_368 + local_360)
      ;
      ExtractValueFromCpuInfoFile
                (&local_2c8,local_310,&local_e0,"physical id",local_310->CurrentPositionInFile + 1);
      std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_2c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
    } while (local_310->CurrentPositionInFile != 0xffffffffffffffff);
  }
  bVar16 = local_60._M_impl.super__Rb_tree_header._M_node_count == 0;
  iVar7 = (int)local_60._M_impl.super__Rb_tree_header._M_node_count;
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_100,local_368,local_368 + local_360);
  pSVar6 = local_310;
  ExtractValueFromCpuInfoFile(&local_2c8,local_310,&local_100,"cpu cores",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  iVar8 = atoi(local_2c8._M_dataplus._M_p);
  iVar7 = (iVar7 + (uint)bVar16) * (iVar8 + (uint)(iVar8 == 0));
  uVar14 = iVar7 + (uint)(iVar7 == 0);
  pSVar6->NumberOfPhysicalCPU = uVar14;
  (pSVar6->Features).ExtendedFeatures.LogicalProcessorsPerPhysical =
       pSVar6->NumberOfLogicalCPU / uVar14;
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_120,local_368,local_368 + local_360);
  ExtractValueFromCpuInfoFile(&local_2e8,pSVar6,&local_120,"cpu MHz",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if (local_2e8._M_string_length == 0) {
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_140,local_368,local_368 + local_360);
    ExtractValueFromCpuInfoFile(&local_308,pSVar6,&local_140,"Cpu0ClkTck",0);
    std::__cxx11::string::operator=((string *)&local_2e8,(string *)&local_308);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    uVar10 = strtoull((char *)CONCAT44(local_2e8._M_dataplus._M_p._4_4_,
                                       (int)local_2e8._M_dataplus._M_p),(char **)0x0,0x10);
    fVar17 = (float)uVar10 / 1e+06;
  }
  else {
    dVar4 = atof((char *)CONCAT44(local_2e8._M_dataplus._M_p._4_4_,(int)local_2e8._M_dataplus._M_p))
    ;
    fVar17 = (float)dVar4;
  }
  pSVar6->CPUSpeedInMHz = fVar17;
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_160,local_368,local_368 + local_360);
  ExtractValueFromCpuInfoFile(&local_308,pSVar6,&local_160,"cpu family",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (local_308._M_string_length == 0) {
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_180,local_368,local_368 + local_360);
    ExtractValueFromCpuInfoFile(&local_330,pSVar6,&local_180,"CPU architecture",0);
    std::__cxx11::string::operator=((string *)&local_308,(string *)&local_330);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    }
  }
  iVar7 = atoi(local_308._M_dataplus._M_p);
  (pSVar6->ChipID).Family = iVar7;
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1a0,local_368,local_368 + local_360);
  ExtractValueFromCpuInfoFile(&local_330,pSVar6,&local_1a0,"vendor_id",0);
  std::__cxx11::string::operator=((string *)&(pSVar6->ChipID).Vendor,(string *)&local_330);
  paVar2 = &local_330.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != paVar2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  FindManufacturer(pSVar6,&local_308);
  if (((pSVar6->ChipID).Family == 0) && (pSVar6->ChipManufacturer == HP)) {
    iVar7 = std::__cxx11::string::compare((char *)&local_308);
    if (iVar7 == 0) {
      iVar7 = 0x11a;
    }
    else {
      iVar7 = std::__cxx11::string::compare((char *)&local_308);
      if (iVar7 != 0) goto LAB_0048fb9f;
      iVar7 = 0x200;
    }
    (pSVar6->ChipID).Family = iVar7;
  }
LAB_0048fb9f:
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1c0,local_368,local_368 + local_360);
  ExtractValueFromCpuInfoFile(&local_330,pSVar6,&local_1c0,"model",0);
  _Var5._M_p = local_330._M_dataplus._M_p;
  iVar7 = atoi(local_330._M_dataplus._M_p);
  (pSVar6->ChipID).Model = iVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5._M_p != paVar2) {
    operator_delete(_Var5._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  bVar16 = RetrieveClassicalCPUIdentity(pSVar6);
  if (!bVar16) {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_1e0,local_368,local_368 + local_360);
    ExtractValueFromCpuInfoFile(&local_330,pSVar6,&local_1e0,"cpu",0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    if (local_330._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&(pSVar6->ChipID).ProcessorName);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != paVar2) {
      operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    }
  }
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_200,local_368,local_368 + local_360);
  ExtractValueFromCpuInfoFile(&local_330,pSVar6,&local_200,"stepping",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if (local_330._M_string_length == 0) {
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_220,local_368,local_368 + local_360);
    ExtractValueFromCpuInfoFile(&local_388,pSVar6,&local_220,"CPU revision",0);
    std::__cxx11::string::operator=((string *)&local_330,(string *)&local_388);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
  }
  iVar7 = atoi(local_330._M_dataplus._M_p);
  (pSVar6->ChipID).Revision = iVar7;
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_240,local_368,local_368 + local_360);
  ExtractValueFromCpuInfoFile(&local_388,pSVar6,&local_240,"model name",0);
  _Var5._M_p = local_388._M_dataplus._M_p;
  pcVar3 = (char *)(pSVar6->ChipID).ModelName._M_string_length;
  strlen(local_388._M_dataplus._M_p);
  std::__cxx11::string::_M_replace((ulong)&(pSVar6->ChipID).ModelName,0,pcVar3,(ulong)_Var5._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  local_348 = (char **)0x0;
  local_338 = (char **)0x0;
  iStack_340._M_current = (char **)0x0;
  local_388._M_dataplus._M_p = "cache size";
  std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_348,(iterator)0x0,
             (char **)&local_388);
  local_388._M_dataplus._M_p = "I-cache";
  if (iStack_340._M_current == local_338) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_348,iStack_340,
               (char **)&local_388);
  }
  else {
    *iStack_340._M_current = "I-cache";
    iStack_340._M_current = iStack_340._M_current + 1;
  }
  local_388._M_dataplus._M_p = "D-cache";
  if (iStack_340._M_current == local_338) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_348,iStack_340,
               (char **)&local_388);
  }
  else {
    *iStack_340._M_current = "D-cache";
    iStack_340._M_current = iStack_340._M_current + 1;
  }
  (pSVar6->Features).L1CacheSize = 0;
  if (iStack_340._M_current != local_348) {
    uVar15 = 0;
    do {
      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_260,local_368,local_368 + local_360);
      ExtractValueFromCpuInfoFile(&local_388,local_310,&local_260,local_348[uVar15],0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
      }
      if (local_388._M_string_length != 0) {
        lVar9 = std::__cxx11::string::find((char *)&local_388,0x593dda,0);
        if (lVar9 != -1) {
          std::__cxx11::string::substr((ulong)&local_2a8,(ulong)&local_388);
          std::__cxx11::string::operator=((string *)&local_388,(string *)&local_2a8);
          if (local_2a8 != &local_298) {
            operator_delete(local_2a8,local_298 + 1);
          }
        }
        iVar7 = atoi(local_388._M_dataplus._M_p);
        piVar1 = &(local_310->Features).L1CacheSize;
        *piVar1 = *piVar1 + iVar7;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != &local_388.field_2) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < (ulong)((long)iStack_340._M_current - (long)local_348 >> 3));
  }
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_280,local_368,local_368 + local_360);
  pSVar6 = local_310;
  ExtractValueFromCpuInfoFile(&local_388,local_310,&local_280,"flags",0);
  __stream = local_288;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if (local_330._M_string_length != 0) {
    std::operator+(&local_80," ",&local_388);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_80);
    plVar12 = plVar11 + 2;
    if ((long *)*plVar11 == plVar12) {
      local_298 = *plVar12;
      lStack_290 = plVar11[3];
      local_2a8 = &local_298;
    }
    else {
      local_298 = *plVar12;
      local_2a8 = (long *)*plVar11;
    }
    local_2a0 = plVar11[1];
    *plVar11 = (long)plVar12;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_388,(string *)&local_2a8);
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    lVar9 = std::__cxx11::string::find((char *)&local_388,0x593dde,0);
    if (lVar9 != -1) {
      (pSVar6->Features).HasFPU = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&local_388,0x593de4,0);
    if (lVar9 != -1) {
      (pSVar6->Features).HasTSC = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&local_388,0x593dea,0);
    if (lVar9 != -1) {
      (pSVar6->Features).HasMMX = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&local_388,0x593df0,0);
    if (lVar9 != -1) {
      (pSVar6->Features).HasSSE = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&local_388,0x593df6,0);
    if (lVar9 != -1) {
      (pSVar6->Features).HasSSE2 = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&local_388,0x593dfd,0);
    if (lVar9 != -1) {
      (pSVar6->Features).HasAPIC = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&local_388,0x593e04,0);
    if (lVar9 != -1) {
      (pSVar6->Features).HasCMOV = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&local_388,0x593e0b,0);
    if (lVar9 != -1) {
      (pSVar6->Features).HasMTRR = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&local_388,0x593e12,0);
    if (lVar9 != -1) {
      (pSVar6->Features).HasACPI = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&local_388,0x593e19,0);
    if (lVar9 != -1) {
      (pSVar6->Features).ExtendedFeatures.Has3DNow = true;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if (local_348 != (char **)0x0) {
    operator_delete(local_348,(long)local_338 - (long)local_348);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_2e8._M_dataplus._M_p._4_4_,(int)local_2e8._M_dataplus._M_p) !=
      &local_2e8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_2e8._M_dataplus._M_p._4_4_,(int)local_2e8._M_dataplus._M_p),
                    local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
LAB_004903c9:
  if (local_368 != &local_358) {
    operator_delete(local_368,CONCAT71(uStack_357,local_358) + 1);
  }
  return __stream != (FILE *)0x0;
}

Assistant:

bool SystemInformationImplementation::RetreiveInformationFromCpuInfoFile()
{
  this->NumberOfLogicalCPU = 0;
  this->NumberOfPhysicalCPU = 0;
  std::string buffer;

  FILE* fd = fopen("/proc/cpuinfo", "r");
  if (!fd) {
    std::cout << "Problem opening /proc/cpuinfo" << std::endl;
    return false;
  }

  size_t fileSize = 0;
  while (!feof(fd)) {
    buffer += static_cast<char>(fgetc(fd));
    fileSize++;
  }
  fclose(fd);
  buffer.resize(fileSize - 2);
  // Number of logical CPUs (combination of multiple processors, multi-core
  // and SMT)
  size_t pos = buffer.find("processor\t");
  while (pos != std::string::npos) {
    this->NumberOfLogicalCPU++;
    pos = buffer.find("processor\t", pos + 1);
  }

#ifdef __linux
  // Count sockets.
  std::set<int> PhysicalIDs;
  std::string idc = this->ExtractValueFromCpuInfoFile(buffer, "physical id");
  while (this->CurrentPositionInFile != std::string::npos) {
    int id = atoi(idc.c_str());
    PhysicalIDs.insert(id);
    idc = this->ExtractValueFromCpuInfoFile(buffer, "physical id",
                                            this->CurrentPositionInFile + 1);
  }
  uint64_t NumberOfSockets = PhysicalIDs.size();
  NumberOfSockets = std::max(NumberOfSockets, (uint64_t)1);
  // Physical ids returned by Linux don't distinguish cores.
  // We want to record the total number of cores in this->NumberOfPhysicalCPU
  // (checking only the first proc)
  std::string Cores = this->ExtractValueFromCpuInfoFile(buffer, "cpu cores");
  unsigned int NumberOfCoresPerSocket = (unsigned int)atoi(Cores.c_str());
  NumberOfCoresPerSocket = std::max(NumberOfCoresPerSocket, 1u);
  this->NumberOfPhysicalCPU =
    NumberOfCoresPerSocket * (unsigned int)NumberOfSockets;

#else // __CYGWIN__
  // does not have "physical id" entries, neither "cpu cores"
  // this has to be fixed for hyper-threading.
  std::string cpucount =
    this->ExtractValueFromCpuInfoFile(buffer, "cpu count");
  this->NumberOfPhysicalCPU = this->NumberOfLogicalCPU =
    atoi(cpucount.c_str());
#endif
  // gotta have one, and if this is 0 then we get a / by 0n
  // better to have a bad answer than a crash
  if (this->NumberOfPhysicalCPU <= 0) {
    this->NumberOfPhysicalCPU = 1;
  }
  // LogicalProcessorsPerPhysical>1 => SMT.
  this->Features.ExtendedFeatures.LogicalProcessorsPerPhysical =
    this->NumberOfLogicalCPU / this->NumberOfPhysicalCPU;

  // CPU speed (checking only the first processor)
  std::string CPUSpeed = this->ExtractValueFromCpuInfoFile(buffer, "cpu MHz");
  if (!CPUSpeed.empty()) {
    this->CPUSpeedInMHz = static_cast<float>(atof(CPUSpeed.c_str()));
  }
#ifdef __linux
  else {
    // Linux Sparc: CPU speed is in Hz and encoded in hexadecimal
    CPUSpeed = this->ExtractValueFromCpuInfoFile(buffer, "Cpu0ClkTck");
    this->CPUSpeedInMHz =
      static_cast<float>(strtoull(CPUSpeed.c_str(), 0, 16)) / 1000000.0f;
  }
#endif

  // Chip family
  std::string familyStr =
    this->ExtractValueFromCpuInfoFile(buffer, "cpu family");
  if (familyStr.empty()) {
    familyStr = this->ExtractValueFromCpuInfoFile(buffer, "CPU architecture");
  }
  this->ChipID.Family = atoi(familyStr.c_str());

  // Chip Vendor
  this->ChipID.Vendor = this->ExtractValueFromCpuInfoFile(buffer, "vendor_id");
  this->FindManufacturer(familyStr);

  // second try for setting family
  if (this->ChipID.Family == 0 && this->ChipManufacturer == HP) {
    if (familyStr == "PA-RISC 1.1a")
      this->ChipID.Family = 0x11a;
    else if (familyStr == "PA-RISC 2.0")
      this->ChipID.Family = 0x200;
    // If you really get CMake to work on a machine not belonging to
    // any of those families I owe you a dinner if you get it to
    // contribute nightly builds regularly.
  }

  // Chip Model
  this->ChipID.Model =
    atoi(this->ExtractValueFromCpuInfoFile(buffer, "model").c_str());
  if (!this->RetrieveClassicalCPUIdentity()) {
    // Some platforms (e.g. PA-RISC) tell us their CPU name here.
    // Note: x86 does not.
    std::string cpuname = this->ExtractValueFromCpuInfoFile(buffer, "cpu");
    if (!cpuname.empty()) {
      this->ChipID.ProcessorName = cpuname;
    }
  }

  // Chip revision
  std::string cpurev = this->ExtractValueFromCpuInfoFile(buffer, "stepping");
  if (cpurev.empty()) {
    cpurev = this->ExtractValueFromCpuInfoFile(buffer, "CPU revision");
  }
  this->ChipID.Revision = atoi(cpurev.c_str());

  // Chip Model Name
  this->ChipID.ModelName =
    this->ExtractValueFromCpuInfoFile(buffer, "model name").c_str();

  // L1 Cache size
  // Different architectures may show different names for the caches.
  // Sum up everything we find.
  std::vector<const char*> cachename;
  cachename.clear();

  cachename.push_back("cache size"); // e.g. x86
  cachename.push_back("I-cache");    // e.g. PA-RISC
  cachename.push_back("D-cache");    // e.g. PA-RISC

  this->Features.L1CacheSize = 0;
  for (size_t index = 0; index < cachename.size(); index++) {
    std::string cacheSize =
      this->ExtractValueFromCpuInfoFile(buffer, cachename[index]);
    if (!cacheSize.empty()) {
      pos = cacheSize.find(" KB");
      if (pos != std::string::npos) {
        cacheSize = cacheSize.substr(0, pos);
      }
      this->Features.L1CacheSize += atoi(cacheSize.c_str());
    }
  }

  // processor feature flags (probably x86 specific)
  std::string cpuflags = this->ExtractValueFromCpuInfoFile(buffer, "flags");
  if (!cpurev.empty()) {
    // now we can match every flags as space + flag + space
    cpuflags = " " + cpuflags + " ";
    if ((cpuflags.find(" fpu ") != std::string::npos)) {
      this->Features.HasFPU = true;
    }
    if ((cpuflags.find(" tsc ") != std::string::npos)) {
      this->Features.HasTSC = true;
    }
    if ((cpuflags.find(" mmx ") != std::string::npos)) {
      this->Features.HasMMX = true;
    }
    if ((cpuflags.find(" sse ") != std::string::npos)) {
      this->Features.HasSSE = true;
    }
    if ((cpuflags.find(" sse2 ") != std::string::npos)) {
      this->Features.HasSSE2 = true;
    }
    if ((cpuflags.find(" apic ") != std::string::npos)) {
      this->Features.HasAPIC = true;
    }
    if ((cpuflags.find(" cmov ") != std::string::npos)) {
      this->Features.HasCMOV = true;
    }
    if ((cpuflags.find(" mtrr ") != std::string::npos)) {
      this->Features.HasMTRR = true;
    }
    if ((cpuflags.find(" acpi ") != std::string::npos)) {
      this->Features.HasACPI = true;
    }
    if ((cpuflags.find(" 3dnow ") != std::string::npos)) {
      this->Features.ExtendedFeatures.Has3DNow = true;
    }
  }

  return true;
}